

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O2

int tcc_output_file(TCCState *s,char *filename)

{
  byte bVar1;
  Section *pSVar2;
  ulong uVar3;
  undefined8 uVar4;
  Elf64_Off EVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  Section *pSVar11;
  sym_attr *psVar12;
  undefined4 *puVar13;
  ulong uVar14;
  FILE *__s;
  Section **ppSVar15;
  undefined8 *__src;
  void *pvVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  ulong uVar20;
  ulong uVar21;
  Elf64_Addr EVar22;
  long *plVar23;
  ulong uVar24;
  uchar *puVar25;
  int iVar26;
  undefined4 *puVar27;
  long lVar28;
  uint *puVar29;
  ulong uVar30;
  uchar *puVar31;
  undefined8 *puVar32;
  long *plVar33;
  unsigned_long uVar34;
  byte *pbVar35;
  int i;
  char *pcVar36;
  int iVar37;
  uint *puVar38;
  uint *puVar39;
  uint uVar40;
  uint uVar41;
  uchar *puVar42;
  long lVar43;
  dyn_inf local_158;
  undefined8 local_128;
  long lStack_120;
  Elf64_Addr local_118;
  unsigned_long uStack_110;
  unsigned_long local_108;
  undefined8 uStack_100;
  long local_f8;
  long lStack_f0;
  ulong local_e8;
  long local_e0;
  char *local_d8;
  long local_d0;
  undefined8 uStack_c8;
  Elf64_Ehdr ehdr;
  unsigned_long local_78;
  undefined4 *local_70;
  Section *local_58;
  ulong local_50;
  Section *local_48;
  Section *local_38;
  
  local_158.data_offset = 0;
  local_158.rel_addr = 0;
  local_158.dynamic = (Section *)0x0;
  local_158.dynstr = (Section *)0x0;
  local_158.rel_size = 0;
  uVar40 = s->output_type;
  s->nb_errors = 0;
  iVar8 = 0;
  local_d8 = filename;
  if (uVar40 == 4) {
    local_38 = (Section *)0x0;
    local_58 = (Section *)0x0;
    local_48 = (Section *)0x0;
LAB_00110294:
    pSVar11 = new_section(s,".shstrtab",3,0);
    put_elf_str(pSVar11,"");
    iVar37 = 1;
    for (uVar20 = 1; (long)uVar20 < (long)s->nb_sections; uVar20 = uVar20 + 1) {
      pSVar2 = s->sections[uVar20];
      if ((((uVar40 == 3) && (pSVar2->sh_type == 4)) && ((pSVar2->sh_flags & 2) == 0)) &&
         ((s->sections[pSVar2->sh_info]->sh_flags & 2) != 0)) {
        iVar26 = 0;
        puVar25 = pSVar2->data;
        for (puVar42 = puVar25; puVar42 < puVar25 + pSVar2->data_offset; puVar42 = puVar42 + 0x18) {
          iVar6 = (int)*(undefined8 *)(puVar42 + 8);
          if (iVar6 - 10U < 2) {
LAB_00110346:
            iVar26 = iVar26 + 1;
          }
          else if (iVar6 == 2) {
            psVar12 = get_sym_attr(s,(int)((ulong)*(undefined8 *)(puVar42 + 8) >> 0x20),0);
            iVar26 = (iVar26 + 1) - (uint)(psVar12->dyn_index == 0);
            puVar25 = pSVar2->data;
          }
          else if (iVar6 == 1) goto LAB_00110346;
        }
        if (iVar26 == 0) goto LAB_001103b4;
        *(byte *)&pSVar2->sh_flags = (byte)pSVar2->sh_flags | 2;
        pSVar2->sh_size = (long)iVar26 * 0x18;
        if ((s->sections[pSVar2->sh_info]->sh_flags & 4) != 0) {
          iVar8 = iVar37;
        }
LAB_001103eb:
        iVar26 = put_elf_str(pSVar11,pSVar2->name);
        pSVar2->sh_name = iVar26;
      }
      else {
LAB_001103b4:
        if (((uVar40 == 4) || (s->do_debug != 0)) ||
           (((pSVar2->sh_flags & 2) != 0 || (uVar20 == s->nb_sections - 1)))) {
          uVar34 = pSVar2->data_offset;
          pSVar2->sh_size = uVar34;
        }
        else {
          uVar34 = pSVar2->sh_size;
        }
        if ((uVar34 != 0) || ((pSVar2->sh_flags & 2) != 0)) goto LAB_001103eb;
      }
    }
    pSVar11->sh_size = pSVar11->data_offset;
    if (local_58 == (Section *)0x0) {
      local_78 = 0;
    }
    else {
      for (lVar43 = 0; lVar43 < s->nb_loaded_dlls; lVar43 = lVar43 + 1) {
        if (s->loaded_dlls[lVar43]->level == 0) {
          iVar26 = put_elf_str(local_48,s->loaded_dlls[lVar43]->name);
          put_dt(local_58,1,(long)iVar26);
        }
      }
      if (s->rpath != (char *)0x0) {
        iVar26 = 0x1d;
        if (s->enable_new_dtags == 0) {
          iVar26 = 0xf;
        }
        iVar6 = put_elf_str(local_48,s->rpath);
        put_dt(local_58,iVar26,(long)iVar6);
      }
      if (uVar40 == 3) {
        if (s->soname != (char *)0x0) {
          iVar26 = put_elf_str(local_48,s->soname);
          put_dt(local_58,0xe,(long)iVar26);
        }
        if (iVar8 != 0) {
          put_dt(local_58,0x16,0);
        }
      }
      if (s->symbolic != 0) {
        put_dt(local_58,0x10,0);
      }
      local_158.dynamic = local_58;
      local_158.dynstr = local_48;
      local_78 = local_58->data_offset;
      local_158.data_offset = local_78;
      fill_dynamic(s,&local_158);
      local_58->sh_size = local_58->data_offset;
      local_48->sh_size = local_48->data_offset;
    }
    uVar20 = 0;
    if (uVar40 != 4) {
      if (uVar40 == 3) {
        uVar20 = 3;
      }
      else {
        uVar20 = (ulong)((uint)(s->static_link == 0) * 3 + 2);
      }
    }
    iVar8 = (int)uVar20;
    uVar24 = (ulong)(uint)(iVar8 * 0x38);
    local_70 = (undefined4 *)tcc_mallocz(uVar24);
    local_d0 = (long)s->nb_sections;
    puVar13 = (undefined4 *)tcc_malloc(local_d0 * 4);
    *puVar13 = 0;
    uVar17 = iVar8 * 0x38 + 0x40;
    uVar41 = 0;
    if (s->output_format == 0) {
      uVar41 = uVar17;
    }
    uVar30 = 0x200000;
    if (s->section_align != 0) {
      uVar30 = (ulong)s->section_align;
    }
    if (iVar8 != 0) {
      iVar37 = (int)uVar30;
      if (s->has_text_addr == 0) {
        EVar22 = (Elf64_Addr)(iVar37 - 1U & uVar41 | (uint)(s->output_type != 3) << 0x16);
      }
      else {
        EVar22 = s->text_addr;
        uVar7 = (uint)EVar22 & iVar37 - 1U;
        uVar18 = uVar41 & iVar37 - 1U;
        iVar26 = 0;
        if ((int)uVar7 < (int)uVar18) {
          iVar26 = iVar37;
        }
        uVar41 = (uVar41 - uVar18) + uVar7 + iVar26;
      }
      local_48 = (Section *)(uVar30 - 1);
      lVar43 = 0x70;
      if (local_38 == (Section *)0x0) {
        lVar43 = 0;
      }
      puVar27 = (undefined4 *)(lVar43 + (long)local_70);
      local_e8 = -uVar30;
      local_e0 = uVar30 + 0xffffffff;
      local_50 = 0;
      iVar37 = 1;
      local_158.rel_size = 0;
      for (iVar26 = 0; iVar26 != 2; iVar26 = iVar26 + 1) {
        *puVar27 = 1;
        puVar27[1] = 6 - (uint)(iVar26 == 0);
        *(ulong *)(puVar27 + 0xc) = uVar30;
        for (iVar6 = 0; iVar6 != 5; iVar6 = iVar6 + 1) {
          for (lVar43 = 1; lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
            pSVar11 = s->sections[lVar43];
            uVar7 = pSVar11->sh_flags & 3;
            if (iVar26 == 0) {
              if (uVar7 == 2) goto LAB_001106d4;
            }
            else if (uVar7 == 3) {
LAB_001106d4:
              if (pSVar11 == local_38) {
                if (iVar6 == 0) goto LAB_0011071e;
              }
              else {
                switch(pSVar11->sh_type) {
                case 3:
                case 5:
                case 0xb:
                  if (iVar6 == 1) {
LAB_0011071e:
                    puVar13[iVar37] = (int)lVar43;
                    uVar21 = (long)-pSVar11->sh_addralign &
                             (EVar22 + (long)pSVar11->sh_addralign) - 1;
                    uVar41 = uVar41 + ((int)uVar21 - (int)EVar22);
                    pSVar11->sh_offset = (long)(int)uVar41;
                    pSVar11->sh_addr = uVar21;
                    if (*(long *)(puVar27 + 2) == 0) {
                      *(long *)(puVar27 + 2) = (long)(int)uVar41;
                      *(ulong *)(puVar27 + 4) = uVar21;
                      *(ulong *)(puVar27 + 6) = uVar21;
                    }
                    iVar37 = iVar37 + 1;
                    if (pSVar11->sh_type == 4) {
                      if (local_158.rel_size == 0) {
                        local_50 = uVar21;
                      }
                      uVar34 = pSVar11->sh_size;
                      local_158.rel_size = local_158.rel_size + uVar34;
                      EVar22 = uVar21 + uVar34;
                    }
                    else {
                      uVar34 = pSVar11->sh_size;
                      EVar22 = uVar21 + uVar34;
                      if (pSVar11->sh_type == 8) break;
                    }
                    uVar41 = uVar41 + (int)uVar34;
                  }
                  break;
                case 4:
                  if (iVar6 == 2) goto LAB_0011071e;
                  break;
                default:
                  if (iVar6 == 3) goto LAB_0011071e;
                  break;
                case 8:
                  if (iVar6 == 4) goto LAB_0011071e;
                }
              }
            }
          }
        }
        uVar21 = *(ulong *)(puVar27 + 2);
        uVar14 = *(ulong *)(puVar27 + 4);
        if (iVar26 == 0) {
          uVar3 = -*(long *)(puVar27 + 0xc);
          uVar21 = uVar21 & uVar3;
          *(ulong *)(puVar27 + 2) = uVar21;
          uVar14 = uVar14 & uVar3;
          *(ulong *)(puVar27 + 4) = uVar14;
          *(ulong *)(puVar27 + 6) = *(ulong *)(puVar27 + 6) & uVar3;
        }
        *(ulong *)(puVar27 + 8) = (long)(int)uVar41 - uVar21;
        *(Elf64_Addr *)(puVar27 + 10) = EVar22 - uVar14;
        if (iVar26 == 0) {
          if (s->output_format == 0) {
            uVar21 = EVar22 & (ulong)local_48;
            if ((EVar22 & (ulong)local_48) != 0) {
              uVar21 = uVar30;
            }
            EVar22 = EVar22 + uVar21;
          }
          else {
            EVar22 = EVar22 + (long)local_48 & local_e8;
            uVar41 = uVar41 + (int)local_e0 & (uint)local_e8;
          }
        }
        puVar27 = puVar27 + 0xe;
      }
      local_158.rel_addr = local_50;
    }
    for (lVar43 = 1; lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
      pSVar11 = s->sections[lVar43];
      if ((iVar8 == 0) || ((pSVar11->sh_flags & 2) == 0)) {
        lVar28 = (long)iVar37;
        iVar37 = iVar37 + 1;
        puVar13[lVar28] = (int)lVar43;
        uVar41 = -pSVar11->sh_addralign & (uVar41 + pSVar11->sh_addralign) - 1;
        pSVar11->sh_offset = (long)(int)uVar41;
        if (pSVar11->sh_type != 8) {
          uVar41 = uVar41 + (int)pSVar11->sh_size;
        }
      }
    }
    ehdr._56_8_ = uVar20;
    if (uVar40 == 4) goto LAB_001108b4;
    if (local_38 != (Section *)0x0) {
      *local_70 = 6;
      *(undefined8 *)(local_70 + 2) = 0x40;
      *(ulong *)(local_70 + 10) = uVar24;
      *(ulong *)(local_70 + 8) = uVar24;
      lVar43 = local_38->sh_addr - uVar24;
      *(long *)(local_70 + 4) = lVar43;
      *(long *)(local_70 + 6) = lVar43;
      local_70[1] = 5;
      *(undefined8 *)(local_70 + 0xc) = 4;
      local_70[0xe] = 3;
      *(unsigned_long *)(local_70 + 0x10) = local_38->sh_offset;
      EVar22 = local_38->sh_addr;
      *(Elf64_Addr *)(local_70 + 0x12) = EVar22;
      *(Elf64_Addr *)(local_70 + 0x14) = EVar22;
      uVar34 = local_38->sh_size;
      *(unsigned_long *)(local_70 + 0x16) = uVar34;
      *(unsigned_long *)(local_70 + 0x18) = uVar34;
      local_70[0xf] = 4;
      *(long *)(local_70 + 0x1a) = (long)local_38->sh_addralign;
    }
    if (local_58 != (Section *)0x0) {
      local_70[uVar20 * 0xe + -0xe] = 2;
      *(unsigned_long *)(local_70 + uVar20 * 0xe + -0xc) = local_58->sh_offset;
      EVar22 = local_58->sh_addr;
      *(Elf64_Addr *)(local_70 + uVar20 * 0xe + -10) = EVar22;
      *(Elf64_Addr *)(local_70 + uVar20 * 0xe + -8) = EVar22;
      uVar34 = local_58->sh_size;
      *(unsigned_long *)(local_70 + uVar20 * 0xe + -6) = uVar34;
      *(unsigned_long *)(local_70 + uVar20 * 0xe + -4) = uVar34;
      local_70[uVar20 * 0xe + -0xd] = 6;
      *(long *)(local_70 + uVar20 * 0xe + -2) = (long)local_58->sh_addralign;
      local_58->data_offset = local_78;
      fill_dynamic(s,&local_158);
      *(int *)s->got->data = (int)local_58->sh_addr;
      if ((uVar40 & 0xfffffffe) == 2) {
        relocate_plt(s);
      }
      pSVar11 = s->dynsym;
      puVar25 = pSVar11->data;
      puVar42 = puVar25;
      do {
        do {
          puVar31 = puVar25;
          puVar25 = puVar31 + 0x18;
          if (puVar42 + pSVar11->data_offset <= puVar25) goto LAB_00110aeb;
        } while (0xfefe < (ushort)(*(ushort *)(puVar31 + 0x1e) - 1));
        *(Elf64_Addr *)(puVar31 + 0x20) =
             *(long *)(puVar31 + 0x20) + s->sections[*(ushort *)(puVar31 + 0x1e)]->sh_addr;
        pSVar11 = s->dynsym;
        puVar42 = pSVar11->data;
      } while( true );
    }
LAB_00110aeb:
    relocate_syms(s,s->symtab,0);
    local_38 = (Section *)puVar13;
    if (s->nb_errors == 0) {
      for (lVar43 = 1; uVar20 = (ulong)s->nb_sections, lVar43 < (long)uVar20; lVar43 = lVar43 + 1) {
        pSVar11 = s->sections[lVar43];
        if ((pSVar11->reloc != (Section *)0x0) && (pSVar11 != s->got)) {
          relocate_section(s,pSVar11);
        }
      }
      for (lVar43 = 1; lVar43 < (int)uVar20; lVar43 = lVar43 + 1) {
        pSVar11 = s->sections[lVar43];
        if (((pSVar11->sh_flags & 2) != 0) && (pSVar11->sh_type == 4)) {
          pSVar2 = s->sections[pSVar11->sh_info];
          plVar23 = (long *)pSVar11->data;
          plVar33 = plVar23;
          for (; plVar23 < (long *)((long)plVar33 + pSVar11->data_offset); plVar23 = plVar23 + 3) {
            *plVar23 = *plVar23 + pSVar2->sh_addr;
            plVar33 = (long *)pSVar11->data;
          }
          uVar20 = (ulong)(uint)s->nb_sections;
        }
      }
      ppSVar15 = (Section **)tcc_malloc((long)(int)uVar20 << 3);
      pvVar16 = tcc_malloc((long)s->nb_sections << 2);
      iVar8 = s->nb_sections;
      uVar7 = 0;
      iVar37 = iVar8;
      for (lVar43 = 0; lVar43 < iVar8; lVar43 = lVar43 + 1) {
        lVar28 = (long)(int)puVar13[lVar43];
        pSVar11 = s->sections[lVar28];
        if ((lVar43 == 0) || (pSVar11->sh_name != 0)) {
          *(uint *)((long)pvVar16 + lVar28 * 4) = uVar7;
          ppSVar15[(int)uVar7] = pSVar11;
          uVar7 = uVar7 + 1;
        }
        else {
          *(undefined4 *)((long)pvVar16 + lVar28 * 4) = 0;
          lVar28 = (long)iVar37;
          iVar37 = iVar37 + -1;
          ppSVar15[lVar28 + -1] = pSVar11;
        }
        iVar8 = s->nb_sections;
      }
      uVar20 = 0;
      uVar30 = 0;
      if (0 < (int)uVar7) {
        uVar30 = (ulong)uVar7;
      }
      for (; pSVar11 = symtab_section, uVar30 != uVar20; uVar20 = uVar20 + 1) {
        pSVar11 = ppSVar15[uVar20];
        if ((pSVar11 != (Section *)0x0) && (pSVar11->sh_num = (int)uVar20, pSVar11->sh_type == 4)) {
          pSVar11->sh_info = *(int *)((long)pvVar16 + (long)pSVar11->sh_info * 4);
        }
      }
      puVar42 = symtab_section->data;
      puVar25 = puVar42;
      do {
        do {
          puVar31 = puVar25;
          puVar25 = puVar31 + 0x18;
          if (puVar42 + pSVar11->data_offset <= puVar25) {
            if (s->static_link != 0) goto LAB_00110cb2;
            pSVar11 = s->dynsym;
            puVar42 = pSVar11->data;
            puVar25 = puVar42;
            goto LAB_00110e53;
          }
        } while (0xfefe < (ushort)(*(ushort *)(puVar31 + 0x1e) - 1));
        *(undefined2 *)(puVar31 + 0x1e) =
             *(undefined2 *)((long)pvVar16 + (ulong)*(ushort *)(puVar31 + 0x1e) * 4);
        puVar42 = pSVar11->data;
      } while( true );
    }
  }
  else {
    tcc_add_runtime(s);
    resolve_common_syms(s);
    if (s->static_link != 0) {
      local_38 = (Section *)0x0;
      local_58 = (Section *)0x0;
      local_48 = (Section *)0x0;
LAB_00110288:
      build_got_entries(s);
      goto LAB_00110294;
    }
    if (uVar40 == 2) {
      pcVar9 = getenv("LD_SO");
      pcVar36 = "/lib64/ld-linux-x86-64.so.2";
      if (pcVar9 != (char *)0x0) {
        pcVar36 = pcVar9;
      }
      local_38 = new_section(s,".interp",1,2);
      local_38->sh_addralign = 1;
      sVar10 = strlen(pcVar36);
      pcVar9 = (char *)section_ptr_add(local_38,sVar10 + 1);
      strcpy(pcVar9,pcVar36);
    }
    else {
      local_38 = (Section *)0x0;
    }
    pSVar11 = new_symtab(s,".dynsym",0xb,2,".dynstr",".hash",2);
    s->dynsym = pSVar11;
    local_48 = pSVar11->link;
    local_58 = new_section(s,".dynamic",6,3);
    local_58->link = local_48;
    local_58->sh_entsize = 0x10;
    build_got(s);
    puVar19 = (uint *)symtab_section->data;
    puVar39 = puVar19;
    if (uVar40 != 2) {
      do {
        puVar38 = puVar39;
        do {
          puVar29 = puVar38;
          puVar38 = puVar29 + 6;
          if ((uint *)((long)puVar19 + symtab_section->data_offset) <= puVar38) goto LAB_00110288;
          puVar39 = puVar39 + 6;
        } while ((byte)puVar29[7] < 0x10);
        iVar37 = put_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar29 + 8),*(unsigned_long *)(puVar29 + 10)
                             ,(uint)(byte)puVar29[7],0,(uint)*(ushort *)((long)puVar29 + 0x1e),
                             (char *)(symtab_section->link->data + *puVar38));
        psVar12 = get_sym_attr(s,(int)(((long)puVar39 - (long)symtab_section->data) / 0x18),1);
        psVar12->dyn_index = iVar37;
        puVar19 = (uint *)symtab_section->data;
        puVar39 = puVar38;
      } while( true );
    }
    while (puVar38 = puVar39 + 6, puVar38 < (uint *)((long)puVar19 + symtab_section->data_offset)) {
      if (*(ushort *)((long)puVar39 + 0x1e) == 0) {
        puVar25 = symtab_section->link->data + *puVar38;
        pSVar11 = s->dynsymtab_section;
        iVar37 = find_elf_sym(pSVar11,(char *)puVar25);
        if (iVar37 == 0) {
          if (((puVar39[7] & 0xf0) != 0x20) &&
             (iVar37 = strcmp((char *)puVar25,"_fp_hw"), iVar37 != 0)) {
            tcc_error_noabort("undefined symbol \'%s\'",puVar25);
          }
        }
        else {
          puVar42 = pSVar11->data;
          lVar43 = (long)iVar37 * 0x18;
          bVar1 = puVar42[lVar43 + 4];
          if ((bVar1 & 7) == 2) {
            iVar37 = put_elf_sym(s->dynsym,0,*(unsigned_long *)(puVar42 + lVar43 + 0x10),0x12,0,0,
                                 (char *)puVar25);
            psVar12 = get_sym_attr(s,(int)(((long)puVar38 - (long)symtab_section->data) / 0x18),1);
            psVar12->dyn_index = iVar37;
          }
          else if ((bVar1 & 0xf) == 1) {
            uVar20 = bss_section->data_offset + 0xf & 0xfffffffffffffff0;
            set_elf_sym(s->symtab,uVar20,*(unsigned_long *)(puVar42 + lVar43 + 0x10),(uint)bVar1,0,
                        bss_section->sh_num,(char *)puVar25);
            iVar37 = put_elf_sym(s->dynsym,uVar20,*(unsigned_long *)(puVar42 + lVar43 + 0x10),
                                 (uint)puVar42[lVar43 + 4],0,bss_section->sh_num,(char *)puVar25);
            if ((puVar42[lVar43 + 4] & 0xf0) == 0x20) {
              pSVar11 = s->dynsymtab_section;
              puVar19 = (uint *)pSVar11->data;
              do {
                puVar39 = puVar19;
                puVar19 = puVar39 + 6;
                if ((uint *)(pSVar11->data_offset + (long)pSVar11->data) <= puVar19)
                goto LAB_001100e7;
              } while ((*(long *)(puVar39 + 8) != *(long *)(puVar42 + lVar43 + 8)) ||
                      (((byte)puVar39[7] & 0xfffffff0) != 0x10));
              put_elf_sym(s->dynsym,uVar20,*(unsigned_long *)(puVar39 + 10),(uint)(byte)puVar39[7],0
                          ,bss_section->sh_num,(char *)(pSVar11->link->data + *puVar19));
            }
LAB_001100e7:
            put_elf_reloc(s->dynsym,bss_section,uVar20,5,iVar37);
            bss_section->data_offset = uVar20 + *(long *)(puVar42 + lVar43 + 0x10);
          }
        }
      }
      else if ((s->rdynamic != 0) && (0xf < (byte)puVar39[7])) {
        set_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar39 + 8),*(unsigned_long *)(puVar39 + 10),
                    (uint)(byte)puVar39[7],0,(uint)*(ushort *)((long)puVar39 + 0x1e),
                    (char *)(symtab_section->link->data + puVar39[6]));
      }
      puVar39 = puVar38;
      puVar19 = (uint *)symtab_section->data;
    }
    if (s->nb_errors == 0) {
      pSVar11 = s->dynsymtab_section;
      puVar19 = (uint *)pSVar11->data;
      puVar39 = puVar19;
      while (pSVar2 = symtab_section, puVar38 = puVar39 + 6,
            puVar38 < (uint *)((long)puVar19 + pSVar11->data_offset)) {
        puVar25 = pSVar11->link->data + *puVar38;
        iVar37 = find_elf_sym(symtab_section,(char *)puVar25);
        if (iVar37 == 0) {
LAB_00110234:
          if ((*(short *)((long)puVar39 + 0x1e) == 0) && ((puVar39[7] & 0xf0) != 0x20)) {
            tcc_warning("undefined dynamic symbol \'%s\'",puVar25);
          }
        }
        else {
          puVar42 = pSVar2->data;
          if ((*(ushort *)(puVar42 + (long)iVar37 * 0x18 + 6) == 0) ||
             (puVar42[(long)iVar37 * 0x18 + 4] < 0x10)) goto LAB_00110234;
          set_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar42 + (long)iVar37 * 0x18 + 8),
                      *(unsigned_long *)(puVar42 + (long)iVar37 * 0x18 + 0x10),
                      (uint)puVar42[(long)iVar37 * 0x18 + 4],0,
                      (uint)*(ushort *)(puVar42 + (long)iVar37 * 0x18 + 6),(char *)puVar25);
        }
        pSVar11 = s->dynsymtab_section;
        puVar39 = puVar38;
        puVar19 = (uint *)pSVar11->data;
      }
      goto LAB_00110288;
    }
    local_70 = (undefined4 *)0x0;
    local_38 = (Section *)0x0;
  }
  iVar8 = -1;
  goto LAB_00111226;
LAB_00110e53:
  do {
    puVar31 = puVar25;
    puVar25 = puVar31 + 0x18;
    if (puVar42 + pSVar11->data_offset <= puVar25) goto LAB_00110cb2;
  } while (0xfefe < (ushort)(*(ushort *)(puVar31 + 0x1e) - 1));
  *(undefined2 *)(puVar31 + 0x1e) =
       *(undefined2 *)((long)pvVar16 + (ulong)*(ushort *)(puVar31 + 0x1e) * 4);
  pSVar11 = s->dynsym;
  puVar42 = pSVar11->data;
  goto LAB_00110e53;
LAB_00110cb2:
  for (lVar43 = 0; lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
    puVar13[lVar43] = (int)lVar43;
  }
  tcc_free(s->sections);
  s->sections = ppSVar15;
  s->nb_sections = uVar7;
  tcc_free(pvVar16);
  if ((uVar40 == 2) && (s->static_link != 0)) {
    fill_got(s);
  }
  else if (s->got != (Section *)0x0) {
    pSVar11 = s->got->reloc;
    plVar23 = (long *)pSVar11->data;
    for (plVar33 = plVar23; plVar33 < (long *)(pSVar11->data_offset + (long)plVar23);
        plVar33 = plVar33 + 3) {
      lVar43 = plVar33[1];
      if ((int)lVar43 == 8) {
        puVar25 = symtab_section->data;
        psVar12 = get_sym_attr(s,(int)((ulong)lVar43 >> 0x20),0);
        if (*plVar33 - s->got->sh_addr != (ulong)psVar12->got_offset) {
          tcc_error_noabort("huh");
        }
        plVar33[1] = 8;
        plVar33[2] = *(long *)(puVar25 + (lVar43 >> 0x20) * 0x18 + 8);
        pSVar11 = s->got->reloc;
        plVar23 = (long *)pSVar11->data;
      }
    }
  }
LAB_001108b4:
  pcVar36 = local_d8;
  uVar40 = 0x1ff;
  if (s->output_type == 4) {
    uVar40 = 0x1b6;
  }
  unlink(local_d8);
  iVar8 = open(pcVar36,0x241,(ulong)uVar40);
  if (iVar8 < 0) {
    tcc_error_noabort("could not write \'%s\'",pcVar36);
    iVar8 = -1;
  }
  else {
    __s = fdopen(iVar8,"wb");
    if (s->verbose != 0) {
      printf("<- %s\n",pcVar36);
    }
    if (s->output_format == 0) {
      iVar8 = s->nb_sections;
      ehdr.e_shoff = 0;
      ehdr.e_flags = 0;
      ehdr.e_ehsize = 0;
      ehdr.e_phentsize = 0;
      ehdr.e_entry = 0;
      ehdr.e_phoff = 0;
      ehdr.e_type = 0;
      ehdr.e_machine = 0;
      ehdr.e_version = 0;
      ehdr.e_ident[0] = '\0';
      ehdr.e_ident[1] = '\0';
      ehdr.e_ident[2] = '\0';
      ehdr.e_ident[3] = '\0';
      ehdr.e_ident[4] = '\0';
      ehdr.e_ident[5] = '\0';
      ehdr.e_ident[6] = '\0';
      ehdr.e_ident[7] = '\0';
      if (ehdr._56_4_ != 0) {
        ehdr.e_shoff = 0x38000000000000;
        ehdr._48_8_ = ehdr._56_8_ & 0xffff;
        ehdr.e_entry = 0x40;
      }
      uStack_c8 = 0x10102464c457f;
      if (s->output_type == 3) {
        ehdr.e_ident[8] = '\x03';
        ehdr.e_ident[9] = '\0';
        ehdr.e_ident[10] = '\0';
        ehdr.e_ident[0xb] = '\0';
        ehdr.e_ident[0xc] = '\0';
        ehdr.e_ident[0xd] = '\0';
        ehdr.e_ident[0xe] = '\0';
        ehdr.e_ident[0xf] = '\0';
        ehdr._16_8_ = text_section->sh_addr;
LAB_00110ec1:
      }
      else {
        if (s->output_type != 4) {
          ehdr.e_ident[8] = '\x02';
          ehdr.e_ident[9] = '\0';
          ehdr.e_ident[10] = '\0';
          ehdr.e_ident[0xb] = '\0';
          ehdr.e_ident[0xc] = '\0';
          ehdr.e_ident[0xd] = '\0';
          ehdr.e_ident[0xe] = '\0';
          ehdr.e_ident[0xf] = '\0';
          ehdr._16_8_ = get_elf_sym_addr(s,"_start",1);
          goto LAB_00110ec1;
        }
        ehdr.e_ident[8] = '\x01';
        ehdr.e_ident[9] = '\0';
      }
      ehdr.e_ident[10] = '>';
      ehdr.e_ident[0xb] = '\0';
      ehdr.e_ident[0xc] = '\x01';
      ehdr.e_ident[0xd] = '\0';
      ehdr.e_ident[0xe] = '\0';
      ehdr.e_ident[0xf] = '\0';
      ehdr.e_phoff = (Elf64_Off)(int)(uVar41 + 3 & 0xfffffffc);
      ehdr.e_shoff._0_6_ = CONCAT24(0x40,(undefined4)ehdr.e_shoff);
      ehdr.e_flags._2_2_ = 0x40;
      ehdr.e_ehsize = (Elf64_Half)iVar8;
      ehdr.e_phentsize = ehdr.e_ehsize - 1;
      fwrite(&uStack_c8,1,0x40,__s);
      fwrite(local_70,1,uVar24,__s);
      pSVar11 = symtab_section;
      uVar30 = 0;
      uVar20 = symtab_section->data_offset / 0x18;
      iVar8 = (int)uVar20;
      uVar34 = (long)iVar8 * 0x18;
      __src = (undefined8 *)tcc_malloc(uVar34);
      pvVar16 = tcc_malloc((long)iVar8 * 4);
      uVar24 = 0;
      if (0 < iVar8) {
        uVar24 = uVar20 & 0xffffffff;
      }
      pbVar35 = pSVar11->data + 4;
      puVar32 = __src;
      for (; uVar24 != uVar30; uVar30 = uVar30 + 1) {
        if (*pbVar35 < 0x10) {
          *(int *)((long)pvVar16 + uVar30 * 4) = (int)(((long)puVar32 - (long)__src) / 0x18);
          puVar32[2] = *(undefined8 *)(pbVar35 + 0xc);
          uVar4 = *(undefined8 *)(pbVar35 + 4);
          *puVar32 = *(undefined8 *)(pbVar35 + -4);
          puVar32[1] = uVar4;
          puVar32 = puVar32 + 3;
        }
        pbVar35 = pbVar35 + 0x18;
      }
      if (pSVar11->sh_size != 0) {
        pSVar11->sh_info = (int)(((long)puVar32 - (long)__src) / 0x18);
      }
      pbVar35 = pSVar11->data + 4;
      for (uVar20 = 0; uVar24 != uVar20; uVar20 = uVar20 + 1) {
        if (0xf < *pbVar35) {
          *(int *)((long)pvVar16 + uVar20 * 4) = (int)(((long)puVar32 - (long)__src) / 0x18);
          puVar32[2] = *(undefined8 *)(pbVar35 + 0xc);
          uVar4 = *(undefined8 *)(pbVar35 + 4);
          *puVar32 = *(undefined8 *)(pbVar35 + -4);
          puVar32[1] = uVar4;
          puVar32 = puVar32 + 3;
        }
        pbVar35 = pbVar35 + 0x18;
      }
      memcpy(pSVar11->data,__src,uVar34);
      tcc_free(__src);
      for (lVar43 = 1; lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
        pSVar2 = s->sections[lVar43];
        if ((pSVar2->sh_type == 4) && (pSVar2->link == pSVar11)) {
          puVar25 = pSVar2->data;
          puVar42 = puVar25;
          for (; puVar25 < puVar42 + pSVar2->data_offset; puVar25 = puVar25 + 0x18) {
            *(ulong *)(puVar25 + 8) =
                 (long)(int)*(long *)(puVar25 + 8) +
                 ((ulong)*(uint *)((long)pvVar16 + (*(long *)(puVar25 + 8) >> 0x20) * 4) << 0x20);
            puVar42 = pSVar2->data;
          }
        }
      }
      tcc_free(pvVar16);
      for (lVar43 = 1; EVar5 = ehdr.e_phoff, lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
        pSVar11 = s->sections[(int)puVar13[lVar43]];
        if (pSVar11->sh_type != 8) {
          for (uVar20 = (ulong)(int)uVar17; uVar20 < pSVar11->sh_offset; uVar20 = uVar20 + 1) {
            fputc(0,__s);
          }
          iVar8 = (int)pSVar11->sh_size;
          if (iVar8 != 0) {
            fwrite(pSVar11->data,1,(long)iVar8,__s);
          }
          uVar17 = (int)uVar20 + iVar8;
        }
      }
      for (uVar20 = (ulong)(int)uVar17; uVar20 < EVar5; uVar20 = uVar20 + 1) {
        fputc(0,__s);
      }
      for (lVar43 = 0; lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
        local_f8 = 0;
        lStack_f0 = 0;
        local_108 = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_128 = 0;
        lStack_120 = 0;
        pSVar11 = s->sections[lVar43];
        if (pSVar11 != (Section *)0x0) {
          local_128 = CONCAT44(pSVar11->sh_type,pSVar11->sh_name);
          lStack_120 = (long)pSVar11->sh_flags;
          lStack_f0 = (long)pSVar11->sh_entsize;
          uStack_100._0_4_ = 0;
          if (pSVar11->link != (Section *)0x0) {
            uStack_100._0_4_ = pSVar11->link->sh_num;
          }
          uStack_100 = CONCAT44(pSVar11->sh_info,(int)uStack_100);
          local_f8 = (long)pSVar11->sh_addralign;
          local_118 = pSVar11->sh_addr;
          uStack_110 = pSVar11->sh_offset;
          local_108 = pSVar11->sh_size;
        }
        fwrite(&local_128,1,0x40,__s);
      }
    }
    else {
      iVar8 = 0;
      for (lVar43 = 1; lVar43 < s->nb_sections; lVar43 = lVar43 + 1) {
        pSVar11 = s->sections[(int)puVar13[lVar43]];
        if ((pSVar11->sh_type != 8) && ((pSVar11->sh_flags & 2) != 0)) {
          for (uVar20 = (ulong)iVar8; uVar20 < pSVar11->sh_offset; uVar20 = uVar20 + 1) {
            fputc(0,__s);
          }
          iVar8 = (int)pSVar11->sh_size;
          fwrite(pSVar11->data,1,(long)iVar8,__s);
          iVar8 = iVar8 + (int)uVar20;
        }
      }
    }
    fclose(__s);
    iVar8 = 0;
  }
  s->nb_sections = (int)local_d0;
  local_38 = (Section *)puVar13;
LAB_00111226:
  tcc_free(local_38);
  tcc_free(local_70);
  return iVar8;
}

Assistant:

LIBTCCAPI int tcc_output_file(TCCState* s, const char* filename) {
  int ret;
#ifdef TCC_TARGET_PE
  if (s->output_type != TCC_OUTPUT_OBJ) {
    ret = pe_output_file(s, filename);
  } else
#endif
    ret = elf_output_file(s, filename);
  return ret;
}